

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void h_predictor_32x8line(__m256i *row,uint8_t *dst,ptrdiff_t stride)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  long in_RDX;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [32];
  undefined1 auVar4 [32];
  __m256i r1;
  __m256i r0;
  int i;
  __m256i inc;
  __m256i m;
  __m256i t [4];
  int local_2a4;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined1 auStack_260 [16];
  undefined8 auStack_250 [15];
  long local_1d8;
  undefined8 *local_1d0;
  undefined1 (*local_1c8) [32];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_141;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 *local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 *local_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  undefined1 local_9c;
  undefined1 local_9b;
  undefined1 local_9a;
  undefined1 local_99;
  undefined1 local_98;
  undefined1 local_97;
  undefined1 local_96;
  undefined1 local_95;
  undefined1 local_94;
  undefined1 local_93;
  undefined1 local_92;
  undefined1 local_91;
  undefined1 local_90;
  undefined1 local_8f;
  undefined1 local_8e;
  undefined1 local_8d;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  undefined1 local_88;
  undefined1 local_87;
  undefined1 local_86;
  undefined1 local_85;
  undefined1 local_84;
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81;
  undefined1 local_80 [16];
  undefined1 auStack_70 [16];
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  local_1c0 = 0;
  uStack_1b8 = 0;
  uStack_1b0 = 0;
  uStack_1a8 = 0;
  local_280 = ZEXT1632(ZEXT816(0));
  local_141 = 4;
  local_81 = 4;
  local_82 = 4;
  local_83 = 4;
  local_84 = 4;
  local_85 = 4;
  local_86 = 4;
  local_87 = 4;
  local_88 = 4;
  local_89 = 4;
  local_8a = 4;
  local_8b = 4;
  local_8c = 4;
  local_8d = 4;
  local_8e = 4;
  local_8f = 4;
  local_90 = 4;
  local_91 = 4;
  local_92 = 4;
  local_93 = 4;
  local_94 = 4;
  local_95 = 4;
  local_96 = 4;
  local_97 = 4;
  local_98 = 4;
  local_99 = 4;
  local_9a = 4;
  local_9b = 4;
  local_9c = 4;
  local_9d = 4;
  local_9e = 4;
  local_9f = 4;
  local_a0 = 4;
  auVar1 = vpinsrb_avx(ZEXT116(4),4,1);
  auVar1 = vpinsrb_avx(auVar1,4,2);
  auVar1 = vpinsrb_avx(auVar1,4,3);
  auVar1 = vpinsrb_avx(auVar1,4,4);
  auVar1 = vpinsrb_avx(auVar1,4,5);
  auVar1 = vpinsrb_avx(auVar1,4,6);
  auVar1 = vpinsrb_avx(auVar1,4,7);
  auVar1 = vpinsrb_avx(auVar1,4,8);
  auVar1 = vpinsrb_avx(auVar1,4,9);
  auVar1 = vpinsrb_avx(auVar1,4,10);
  auVar1 = vpinsrb_avx(auVar1,4,0xb);
  auVar1 = vpinsrb_avx(auVar1,4,0xc);
  auVar1 = vpinsrb_avx(auVar1,4,0xd);
  auVar1 = vpinsrb_avx(auVar1,4,0xe);
  auVar1 = vpinsrb_avx(auVar1,4,0xf);
  auVar2 = vpinsrb_avx(ZEXT116(4),4,1);
  auVar2 = vpinsrb_avx(auVar2,4,2);
  auVar2 = vpinsrb_avx(auVar2,4,3);
  auVar2 = vpinsrb_avx(auVar2,4,4);
  auVar2 = vpinsrb_avx(auVar2,4,5);
  auVar2 = vpinsrb_avx(auVar2,4,6);
  auVar2 = vpinsrb_avx(auVar2,4,7);
  auVar2 = vpinsrb_avx(auVar2,4,8);
  auVar2 = vpinsrb_avx(auVar2,4,9);
  auVar2 = vpinsrb_avx(auVar2,4,10);
  auVar2 = vpinsrb_avx(auVar2,4,0xb);
  auVar2 = vpinsrb_avx(auVar2,4,0xc);
  auVar2 = vpinsrb_avx(auVar2,4,0xd);
  auVar2 = vpinsrb_avx(auVar2,4,0xe);
  auVar2 = vpinsrb_avx(auVar2,4,0xf);
  auVar4._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  auVar4._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  local_c0 = auVar4;
  local_1d8 = in_RDX;
  local_1d0 = in_RSI;
  local_1c8 = in_RDI;
  for (local_2a4 = 0; uStack_288 = auVar4._24_8_, uStack_290 = auVar4._16_8_, local_2a4 < 4;
      local_2a4 = local_2a4 + 1) {
    local_180 = *(undefined8 *)*local_1c8;
    uStack_178 = *(undefined8 *)(*local_1c8 + 8);
    uStack_170 = *(undefined8 *)(*local_1c8 + 0x10);
    uStack_168 = *(undefined8 *)(*local_1c8 + 0x18);
    local_1a0 = local_280._0_8_;
    uStack_198 = local_280._8_8_;
    uStack_190 = local_280._16_8_;
    uStack_188 = local_280._24_8_;
    auVar3 = vpshufb_avx2(*local_1c8,local_280);
    *(undefined1 (*) [32])(auStack_260 + (long)local_2a4 * 0x20) = auVar3;
    local_100 = auStack_250[(long)local_2a4 * 4];
    uStack_f8 = auStack_250[(long)local_2a4 * 4 + 1];
    local_140 = auStack_250[(long)local_2a4 * 4 + 2];
    uStack_138 = auStack_250[(long)local_2a4 * 4 + 3];
    local_c8 = local_1d0;
    uStack_f0 = local_100;
    uStack_e8 = uStack_f8;
    *local_1d0 = local_100;
    local_1d0[1] = uStack_f8;
    local_1d0[2] = local_100;
    local_1d0[3] = uStack_f8;
    local_108 = local_1d0 + local_1d8 * 2;
    uStack_130 = local_140;
    uStack_128 = uStack_138;
    *local_108 = local_140;
    local_108[1] = uStack_138;
    local_108[2] = local_140;
    local_108[3] = uStack_138;
    local_1d0 = (undefined8 *)(local_1d8 + (long)local_1d0);
    local_60 = local_280._0_8_;
    uStack_58 = local_280._8_8_;
    uStack_50 = local_280._16_8_;
    uStack_48 = local_280._24_8_;
    local_80 = auVar4._0_16_;
    auStack_70 = auVar4._16_16_;
    auVar3._16_8_ = uStack_290;
    auVar3._0_16_ = auVar4._0_16_;
    auVar3._24_8_ = uStack_288;
    local_280 = vpaddb_avx2(local_280,auVar3);
  }
  return;
}

Assistant:

static inline void h_predictor_32x8line(const __m256i *row, uint8_t *dst,
                                        ptrdiff_t stride) {
  __m256i t[4];
  __m256i m = _mm256_setzero_si256();
  const __m256i inc = _mm256_set1_epi8(4);
  int i;

  for (i = 0; i < 4; i++) {
    t[i] = _mm256_shuffle_epi8(*row, m);
    __m256i r0 = _mm256_permute2x128_si256(t[i], t[i], 0);
    __m256i r1 = _mm256_permute2x128_si256(t[i], t[i], 0x11);
    _mm256_storeu_si256((__m256i *)dst, r0);
    _mm256_storeu_si256((__m256i *)(dst + (stride << 4)), r1);
    dst += stride;
    m = _mm256_add_epi8(m, inc);
  }
}